

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree::last_visible_item(Fl_Tree *this)

{
  int iVar1;
  Fl_Tree_Item *local_20;
  Fl_Tree_Item *item;
  Fl_Tree *this_local;
  
  local_20 = last(this);
  while( true ) {
    if (local_20 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    iVar1 = Fl_Tree_Item::visible(local_20);
    if (iVar1 != 0) break;
    local_20 = prev(this,local_20);
  }
  if ((local_20 == this->_root) && (iVar1 = showroot(this), iVar1 == 0)) {
    return (Fl_Tree_Item *)0x0;
  }
  return local_20;
}

Assistant:

Fl_Tree_Item* Fl_Tree::last_visible_item() {
  Fl_Tree_Item *item = last();
  while ( item ) {
    if ( item->visible() ) {
      if ( item == _root && !showroot() ) {
        return(0);
      } else {
        return(item);
      }
    }
    item = prev(item);
  }
  return(item);
}